

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int ARKStepComputeState(void *arkode_mem,N_Vector zcor,N_Vector z)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeARKStepMem local_28;
  ARKodeMem local_20;
  
  iVar1 = arkStep_AccessStepMem(arkode_mem,"ARKStepComputeState",&local_20,&local_28);
  if (iVar1 == 0) {
    N_VLinearSum(1.0,local_28->zpred,1.0,zcor,z);
  }
  return iVar1;
}

Assistant:

int ARKStepComputeState(void *arkode_mem, N_Vector zcor, N_Vector z)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeARKStepMem step_mem;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(arkode_mem, "ARKStepComputeState",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  N_VLinearSum(ONE, step_mem->zpred, ONE, zcor, z);

  return(ARK_SUCCESS);
}